

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O0

void __thiscall DActiveButton::Tick(DActiveButton *this)

{
  bool bVar1;
  DWORD DVar2;
  FSwitchDef *local_50;
  FSoundID local_34;
  undefined1 local_30 [3];
  bool killme;
  FSwitchDef *local_18;
  FSwitchDef *def;
  DActiveButton *this_local;
  
  def = (FSwitchDef *)this;
  if (this->m_SwitchDef == (FSwitchDef *)0x0) {
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  else {
    if ((this->bReturning & 1U) == 0) {
      local_50 = this->m_SwitchDef;
    }
    else {
      local_50 = this->m_SwitchDef->PairDef;
    }
    local_18 = local_50;
    DVar2 = this->m_Timer - 1;
    this->m_Timer = DVar2;
    if (DVar2 == 0) {
      if (this->m_Frame == local_50->NumFrames - 1) {
        this->bReturning = true;
        local_18 = this->m_SwitchDef->PairDef;
        if (local_18 == (FSwitchDef *)0x0) {
          (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
          return;
        }
        this->m_Frame = -1;
        TVector3<double>::TVector3((TVector3<double> *)local_30,&this->m_Pos,0.0);
        if (local_18->Sound == 0) {
          FSoundID::FSoundID(&local_34,"switches/normbutn");
        }
        else {
          FSoundID::FSoundID(&local_34,local_18->Sound);
        }
        S_Sound((DVector3 *)local_30,10,&local_34,1.0,3.0);
        this->bFlippable = false;
      }
      bVar1 = AdvanceFrame(this);
      side_t::SetTexture(this->m_Side,(int)this->m_Part,
                         (FTextureID)local_18->frames[this->m_Frame].Texture.texnum);
      if (bVar1) {
        (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
      }
    }
  }
  return;
}

Assistant:

void DActiveButton::Tick ()
{
	if (m_SwitchDef == NULL)
	{
		// We lost our definition due to a bad savegame.
		Destroy();
		return;
	}

	FSwitchDef *def = bReturning? m_SwitchDef->PairDef : m_SwitchDef;
	if (--m_Timer == 0)
	{
		if (m_Frame == def->NumFrames - 1)
		{
			bReturning = true;
			def = m_SwitchDef->PairDef;
			if (def != NULL)
			{
				m_Frame = -1;
				S_Sound (DVector3(m_Pos, 0), CHAN_VOICE|CHAN_LISTENERZ,
					def->Sound != 0 ? FSoundID(def->Sound) : FSoundID("switches/normbutn"),
					1, ATTN_STATIC);
				bFlippable = false;
			}
			else
			{
				Destroy ();
				return;
			}
		}
		bool killme = AdvanceFrame ();

		m_Side->SetTexture(m_Part, def->frames[m_Frame].Texture);

		if (killme)
		{
			Destroy ();
		}
	}
}